

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode Curl_senddata(Curl_easy *data,void *buffer,size_t buflen,ssize_t *n)

{
  undefined1 local_e8 [8];
  sigpipe_ignore pipe_st;
  connectdata *c;
  ssize_t n1;
  CURLcode result;
  curl_socket_t sfd;
  ssize_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  Curl_easy *data_local;
  
  pipe_st.no_signal = false;
  pipe_st._153_7_ = 0;
  _result = n;
  n_local = (ssize_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = data;
  n1._0_4_ = easy_connection(data,(curl_socket_t *)((long)&n1 + 4),
                             (connectdata **)&pipe_st.no_signal);
  data_local._4_4_ = (CURLcode)n1;
  if ((CURLcode)n1 == CURLE_OK) {
    if (*(long *)((long)buffer_local + 0x18) == 0) {
      Curl_attach_connection((Curl_easy *)buffer_local,(connectdata *)pipe_st._152_8_);
    }
    *_result = 0;
    sigpipe_ignore((Curl_easy *)buffer_local,(sigpipe_ignore *)local_e8);
    n1._0_4_ = Curl_write((Curl_easy *)buffer_local,n1._4_4_,(void *)buflen_local,(size_t)n_local,
                          (ssize_t *)&c);
    sigpipe_restore((sigpipe_ignore *)local_e8);
    if (c == (connectdata *)0xffffffffffffffff) {
      data_local._4_4_ = CURLE_SEND_ERROR;
    }
    else if (((CURLcode)n1 == CURLE_OK) && (c == (connectdata *)0x0)) {
      data_local._4_4_ = CURLE_AGAIN;
    }
    else {
      *_result = (ssize_t)c;
      data_local._4_4_ = (CURLcode)n1;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_senddata(struct Curl_easy *data, const void *buffer,
                       size_t buflen, ssize_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  *n = 0;
  sigpipe_ignore(data, &pipe_st);
  result = Curl_write(data, sfd, buffer, buflen, &n1);
  sigpipe_restore(&pipe_st);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = n1;

  return result;
}